

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontStructMatrix.cpp
# Opt level: O0

void * TPZParFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>::
       ElementAssemble(void *t)

{
  long index;
  TPZCompEl *pTVar1;
  bool bVar2;
  TPZAdmChunkVector<TPZCompEl_*,_10> *pTVar3;
  int64_t iVar4;
  TPZElementMatrixT<double> *this;
  TPZCompMesh *mesh;
  TPZCompEl **ppTVar5;
  void *pvVar6;
  TPZGuiInterface *this_00;
  void *pvVar7;
  ostream *poVar8;
  long in_RDI;
  lock_guard<std::mutex> global_ass;
  TPZElementMatrixT<double> *ef;
  TPZElementMatrixT<double> *ek;
  TPZCompEl *el;
  int64_t local_element;
  unique_lock<std::mutex> assemble_lock;
  TPZAdmChunkVector<TPZCompEl_*,_10> *elementvec;
  TPZParFrontStructMatrix<TPZFrontNonSym<double>,_double,_TPZStructMatrixTBBFlow<double>_> *parfront
  ;
  mutex_type *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  TPZElementMatrix *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  int64_t in_stack_ffffffffffffff58;
  TPZChunkVector<TPZCompEl_*,_10> *in_stack_ffffffffffffff60;
  MType type;
  uint local_4c;
  
  pTVar3 = TPZCompMesh::ElementVec(*(TPZCompMesh **)(in_RDI + 8));
  type = (MType)((ulong)pTVar3 >> 0x20);
  if (*(long *)(in_RDI + 0xf0) <= *(long *)(in_RDI + 0xe0)) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "static void *TPZParFrontStructMatrix<TPZFrontNonSym<double>, double, TPZStructMatrixTBBFlow<STATE>>::ElementAssemble(void *) [TFront = TPZFrontNonSym<double>, TVar = double, TPar = TPZStructMatrixTBBFlow<STATE>]"
                            );
    std::operator<<(poVar8," Falling through \n");
    return (void *)0x0;
  }
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
            );
  iVar4 = TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x110));
  if (iVar4 == *(int *)(in_RDI + 0xf8)) {
    std::condition_variable::wait((unique_lock *)stackfull);
  }
  index = *(long *)(in_RDI + 0xe0);
  if (index == *(long *)(in_RDI + 0xf0)) {
    std::unique_lock<std::mutex>::unlock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    local_4c = 1;
  }
  else {
    *(long *)(in_RDI + 0xe0) = *(long *)(in_RDI + 0xe0) + 1;
    std::unique_lock<std::mutex>::unlock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    this = (TPZElementMatrixT<double> *)
           TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xb0),index);
    if (*(int *)&(this->super_TPZElementMatrix)._vptr_TPZElementMatrix < 0) {
      local_4c = 2;
    }
    else {
      mesh = (TPZCompMesh *)TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0xb0),index);
      ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      pTVar1 = *ppTVar5;
      if (pTVar1 == (TPZCompEl *)0x0) {
        local_4c = 2;
      }
      else {
        pvVar7 = operator_new(0x4340);
        TPZElementMatrixT<double>::TPZElementMatrixT(this,mesh,type);
        pvVar6 = operator_new(0x4340);
        TPZElementMatrixT<double>::TPZElementMatrixT(this,mesh,type);
        (**(code **)(*(long *)pTVar1 + 0x108))(pTVar1,pvVar7,pvVar6);
        std::lock_guard<std::mutex>::lock_guard
                  ((lock_guard<std::mutex> *)
                   CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                   in_stack_ffffffffffffff38);
        TPZStack<long,_10>::Push
                  ((TPZStack<long,_10> *)
                   CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                   (long)in_stack_ffffffffffffff48);
        TPZStack<TPZElementMatrix_*,_10>::Push
                  ((TPZStack<TPZElementMatrix_*,_10> *)
                   CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
        TPZStack<TPZElementMatrix_*,_10>::Push
                  ((TPZStack<TPZElementMatrix_*,_10> *)
                   CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff48);
        std::condition_variable::notify_all();
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1de1e62);
        bVar2 = ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0xd8));
        if (bVar2) {
          this_00 = TPZAutoPointer<TPZGuiInterface>::operator->
                              ((TPZAutoPointer<TPZGuiInterface> *)(in_RDI + 0xd8));
          in_stack_ffffffffffffff47 = TPZGuiInterface::AmIKilled(this_00);
          if ((bool)in_stack_ffffffffffffff47) {
            local_4c = 3;
            goto LAB_01de1f3c;
          }
        }
        local_4c = 0;
      }
    }
  }
LAB_01de1f3c:
  std::unique_lock<std::mutex>::~unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  pvVar7 = (void *)(*(code *)(&DAT_020d2864 + *(int *)(&DAT_020d2864 + (ulong)local_4c * 4)))();
  return pvVar7;
}

Assistant:

void *TPZParFrontStructMatrix<TFront,TVar,TPar>::ElementAssemble(void *t){
    
    
	TPZParFrontStructMatrix<TFront,TVar,TPar> *parfront = (TPZParFrontStructMatrix<TFront,TVar,TPar> *) t;
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = parfront->fMesh->ElementVec();
	
	
	while(parfront->fCurrentElement < parfront->fNElements) {
		
		/**
		 *Lock mutex and search for an avilable element
		 *A global variable to be updated whenever a element is processed
		 */
		
		//Lock a mutex and get an element number
        std::unique_lock<std::mutex> assemble_lock(mutex_element_assemble);
//        assemble_lock.lock();

		//Stack is full and process must wait here!
		if(parfront->felnum.NElements()==parfront->fMaxStackSize)
        {
			/*          cout << "    Stack full" << endl;
			 cout << "    Waiting" << endl;
			 cout.flush();*/
			//cout << "Mutex unlocked on Condwait" << endl;
#ifdef PZ_LOG
            if (logger.isDebugEnabled())
			{
				std::stringstream sout;
				sout << "Entering cond_wait because of stack overflow ";
				LOGPZ_DEBUG(logger,sout.str())
			}
#endif
            stackfull.wait(assemble_lock);
			//cout << "Mutex LOCKED leaving Condwait" << endl;
			
        }
		
		//cout << "Locking mutex_element_assemble" << endl;
		//cout.flush();
		int64_t local_element = parfront->fCurrentElement;
		if(local_element==parfront->fNElements)
        {
            assemble_lock.unlock();
            return 0;
        }
		/*          cout << "All element matrices assembled" << endl;
		 return 0;
		 }
		 */
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Computing element " << local_element;
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		parfront->fCurrentElement++;
		//Unlock mutex and / or send a broadcast
		//cout << "Computing Element " << parfront->fCurrentElement << endl;
		//cout << "Unlocking mutex_element_assemble" << endl;
		//cout.flush();
        assemble_lock.unlock();

		
		if(parfront->fElementOrder[local_element] < 0) continue;
		TPZCompEl *el = elementvec[parfront->fElementOrder[local_element]];
		if(!el) continue;
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		auto *ek =
            new TPZElementMatrixT<TVar>(parfront->fMesh,TPZElementMatrix::EK);
		auto *ef =
            new TPZElementMatrixT<TVar>(parfront->fMesh,TPZElementMatrix::EF);
		
		el->CalcStiff(*ek, *ef);
		//Locks a mutex and adds element contribution to frontmatrix
		//if mutex is locked go to condwait waiting for an specific condvariable
		// este mutex deve ser outro mutex -> mutexassemble
        {
            std::lock_guard<std::mutex> global_ass(mutex_global_assemble);
            //cout << "Locking mutex_global_assemble" << endl;
            //cout << "Pushing variables to the stack" << endl;
            //cout.flush();
            
            // colocar ek, ef e o element_local no stack
            parfront->felnum.Push(local_element);
            parfront->fekstack.Push(ek);
            parfront->fefstack.Push(ef);
            
    #ifdef PZ_LOG
            if (logger.isDebugEnabled())
            {
                std::stringstream sout;
                sout << "Pushing element " << local_element << " on the stack, stack sizes " << parfront->felnum.NElements() << " " << parfront->fekstack.NElements() << " " << parfront->fefstack.NElements();
                LOGPZ_DEBUG(logger,sout.str())
            }
    #endif
            // Outro thread procura se stack contem o proximo elemento
            // qdo nao encontra entra em condwait de acordo com condassemble
            // isso ocorre num outro processo
            // Uma vez que uma nova ek foi adicionada ao stack
            // chame broadcast para acordar o thread que faz assemblagem global
            
            //cout << "Unlocking mutex_global_assemble" << endl;
            //cout << "Broadcasting condassemble" << endl;
            //cout.flush();
            
            /*     if(!(parfront->fCurrentElement%20)){
             cout << endl << "Computing " << parfront->fCurrentElement << " on thread " << std::this_thread::get_id() << endl;
             cout << " " << (100*parfront->fCurrentElement/parfront->fNElements) << "% Elements computed" << "     " << (100*parfront->fCurrentAssembled/parfront->fNElements) << "% Elements assembled" << endl;
             }
             cout << '*';
             cout.flush();
             */
            //Alterado cond_broadcast para cond_signal
            //invertendo a sequencia das chamadas
            condassemble.notify_all();
        }
		// o thread de assemblagem utiliza mutexassemble
		// e feito em outro thread     AssembleElement(el, ek, ef, stiffness, rhs);
		
		if(parfront->fGuiInterface) if(parfront->fGuiInterface->AmIKilled()){
			break;
		}
	}//fim for iel
	
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " Falling through";
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << __PRETTY_FUNCTION__ << " Falling through \n";
    
	return NULL;
	
}